

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall Am_Object_Advanced::Set_Demons(Am_Object_Advanced *this,Am_Demon_Set *methods)

{
  Am_Object_Data *pAVar1;
  Am_Demon_Set_Data *pAVar2;
  
  pAVar1 = (this->super_Am_Object).data;
  if (pAVar1 != (Am_Object_Data *)0x0) {
    Am_Demon_Set_Data::Release(pAVar1->demon_set);
    pAVar2 = methods->data;
    ((this->super_Am_Object).data)->demon_set = pAVar2;
    pAVar2->refs = pAVar2->refs + 1;
    return;
  }
  Am_Error("** Set_Demons called on a (0L) object.");
}

Assistant:

void
Am_Object_Advanced::Set_Demons(const Am_Demon_Set &methods)
{
  if (!data)
    Am_Error("** Set_Demons called on a (0L) object.");
  data->demon_set->Release();
  data->demon_set = methods;
  data->demon_set->Note_Reference();
}